

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<int,QVariant>>(QDataStream *s,QMap<int,_QVariant> *c)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  QDataStream *pQVar4;
  QVariant *pQVar5;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDataStream *in_stack_ffffffffffffffa8;
  QMap<int,_QVariant> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<int,_QVariant>::size(in_stack_ffffffffffffffb0);
  bVar2 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x851b21);
  if (bVar2) {
    QMap<int,_QVariant>::constBegin((QMap<int,_QVariant> *)in_stack_ffffffffffffffa8);
    QMap<int,_QVariant>::constEnd((QMap<int,_QVariant> *)in_stack_ffffffffffffffa8);
    while (bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffffb0,
                                (const_iterator *)in_stack_ffffffffffffffa8), bVar2) {
      piVar3 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x851b93);
      pQVar4 = (QDataStream *)QDataStream::operator<<(in_RDI,*piVar3);
      pQVar5 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x851bae);
      ::operator<<(pQVar4,pQVar5);
      QMap<int,_QVariant>::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}